

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_record.cc
# Opt level: O0

bool bssl::dtls_seal_record
               (SSL *ssl,DTLSRecordNumber *out_number,uint8_t *out,size_t *out_len,size_t max_out,
               uint8_t type,uint8_t *in,size_t in_len,uint16_t epoch)

{
  Span<const_unsigned_char> header_00;
  ushort record_version_00;
  uint8_t type_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  DTLSWriteEpoch *this;
  pointer pSVar5;
  void *pvVar6;
  uint64_t uVar7;
  uint8_t *out_prefix;
  uint8_t *out_00;
  uint8_t *out_suffix;
  pointer pRVar8;
  DTLSRecordNumber DVar9;
  ulong uVar10;
  Span<const_unsigned_char> in_00;
  Span<unsigned_char> local_f0;
  byte local_da;
  byte local_d9;
  undefined1 auStack_d8 [6];
  uint8_t mask [2];
  Span<const_unsigned_char> sample;
  undefined1 local_b0 [8];
  Span<const_unsigned_char> header;
  size_t sStack_98;
  uint16_t record_version;
  size_t ciphertext_len;
  size_t extra_in_len;
  uint8_t *extra_in;
  DTLSRecordNumber DStack_78;
  bool dtls13_header;
  DTLSRecordNumber record_number;
  size_t record_header_len;
  DTLSWriteEpoch *write_epoch;
  size_t prefix;
  size_t sStack_50;
  uint8_t type_local;
  size_t max_out_local;
  size_t *out_len_local;
  uint8_t *out_local;
  DTLSRecordNumber *out_number_local;
  SSL *ssl_local;
  
  prefix._7_1_ = type;
  sStack_50 = max_out;
  max_out_local = (size_t)out_len;
  out_len_local = (size_t *)out;
  out_local = (uint8_t *)out_number;
  out_number_local = (DTLSRecordNumber *)ssl;
  sVar4 = dtls_seal_prefix_len(ssl,epoch);
  iVar2 = buffers_alias(in,in_len,out_len_local,sStack_50);
  if ((iVar2 == 0) || ((sVar4 <= sStack_50 && ((uint8_t *)((long)out_len_local + sVar4) == in)))) {
    this = dtls_get_write_epoch((SSL *)out_number_local,epoch);
    if (this == (DTLSWriteEpoch *)0x0) {
      ERR_put_error(0x10,0,0x44,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/dtls_record.cc"
                    ,0x1ed);
      ssl_local._7_1_ = false;
    }
    else {
      record_number.combined_ = dtls_record_header_write_len((SSL *)out_number_local,epoch);
      DStack_78.combined_ = (this->next_record).combined_;
      bVar1 = DTLSRecordNumber::HasNext(&stack0xffffffffffffff88);
      if (bVar1) {
        extra_in._7_1_ = use_dtls13_record_header((SSL *)out_number_local,epoch);
        extra_in_len = 0;
        if ((bool)extra_in._7_1_) {
          extra_in_len = (long)&prefix + 7;
        }
        ciphertext_len = (size_t)extra_in._7_1_;
        pSVar5 = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator->
                           (&this->aead);
        bVar1 = SSLAEADContext::CiphertextLen(pSVar5,&stack0xffffffffffffff68,in_len,ciphertext_len)
        ;
        if (bVar1) {
          if (sStack_50 < record_number.combined_ + sStack_98) {
            ERR_put_error(0x10,0,0x79,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/dtls_record.cc"
                          ,0x209);
            ssl_local._7_1_ = false;
          }
          else {
            header.size_._6_2_ = dtls_record_version((SSL *)out_number_local);
            if ((extra_in._7_1_ & 1) == 0) {
              *(uint8_t *)out_len_local = prefix._7_1_;
              CRYPTO_store_u16_be((void *)((long)out_len_local + 1),header.size_._6_2_);
              pvVar6 = (void *)((long)out_len_local + 3);
              uVar7 = DTLSRecordNumber::combined(&stack0xffffffffffffff88);
              CRYPTO_store_u64_be(pvVar6,uVar7);
              CRYPTO_store_u16_be((void *)((long)out_len_local + 0xb),(uint16_t)sStack_98);
            }
            else {
              *(byte *)out_len_local = (byte)epoch & 3 | 0x2c;
              pvVar6 = (void *)((long)out_len_local + 1);
              uVar7 = DTLSRecordNumber::sequence(&this->next_record);
              CRYPTO_store_u16_be(pvVar6,(uint16_t)uVar7);
              CRYPTO_store_u16_be((void *)((long)out_len_local + 3),(uint16_t)sStack_98);
            }
            Span<const_unsigned_char>::Span
                      ((Span<const_unsigned_char> *)local_b0,(uchar *)out_len_local,
                       record_number.combined_);
            pSVar5 = std::unique_ptr<bssl::SSLAEADContext,_bssl::internal::Deleter>::operator->
                               (&this->aead);
            type_00 = prefix._7_1_;
            record_version_00 = header.size_._6_2_;
            out_prefix = (uint8_t *)((long)out_len_local + record_number.combined_);
            out_00 = (uint8_t *)((long)out_len_local + sVar4);
            out_suffix = (uint8_t *)((long)out_len_local + in_len + sVar4);
            uVar7 = dtls_aead_sequence((SSL *)out_number_local,DStack_78);
            uVar10 = (ulong)record_version_00;
            header_00.size_ = (size_t)header.data_;
            header_00.data_ = (uchar *)local_b0;
            bVar1 = SSLAEADContext::SealScatter
                              (pSVar5,out_prefix,out_00,out_suffix,type_00,record_version_00,uVar7,
                               header_00,in,in_len,(uint8_t *)extra_in_len,ciphertext_len);
            if (bVar1) {
              if ((extra_in._7_1_ & 1) != 0) {
                Span<const_unsigned_char>::Span
                          ((Span<const_unsigned_char> *)auStack_d8,
                           (uchar *)((long)out_len_local + record_number.combined_),sStack_98);
                pRVar8 = std::unique_ptr<bssl::RecordNumberEncrypter,_bssl::internal::Deleter>::
                         operator->(&this->rn_encrypter);
                Span<unsigned_char>::Span<2ul>(&local_f0,(uchar (*) [2])&local_da);
                uVar3 = (*pRVar8->_vptr_RecordNumberEncrypter[4])
                                  (pRVar8,local_f0.data_,local_f0.size_,_auStack_d8,sample.data_);
                if ((uVar3 & 1) == 0) {
                  return false;
                }
                *(byte *)((long)out_len_local + 1) = *(byte *)((long)out_len_local + 1) ^ local_da;
                *(byte *)((long)out_len_local + 2) = *(byte *)((long)out_len_local + 2) ^ local_d9;
              }
              *(uint64_t *)out_local = DStack_78.combined_;
              DVar9 = DTLSRecordNumber::Next(&stack0xffffffffffffff88);
              (this->next_record).combined_ = DVar9.combined_;
              *(uint64_t *)max_out_local = record_number.combined_ + sStack_98;
              in_00.size_ = uVar10;
              in_00.data_ = header.data_;
              ssl_do_msg_callback((bssl *)out_number_local,(SSL *)0x1,0x100,local_b0._0_4_,in_00);
              ssl_local._7_1_ = true;
            }
            else {
              ssl_local._7_1_ = false;
            }
          }
        }
        else {
          ERR_put_error(0x10,0,200,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/dtls_record.cc"
                        ,0x205);
          ssl_local._7_1_ = false;
        }
      }
      else {
        ERR_put_error(0x10,0,0x45,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/dtls_record.cc"
                      ,0x1f6);
        ssl_local._7_1_ = false;
      }
    }
  }
  else {
    ERR_put_error(0x10,0,0xbd,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/dtls_record.cc"
                  ,0x1e6);
    ssl_local._7_1_ = false;
  }
  return ssl_local._7_1_;
}

Assistant:

bool dtls_seal_record(SSL *ssl, DTLSRecordNumber *out_number, uint8_t *out,
                      size_t *out_len, size_t max_out, uint8_t type,
                      const uint8_t *in, size_t in_len, uint16_t epoch) {
  const size_t prefix = dtls_seal_prefix_len(ssl, epoch);
  if (buffers_alias(in, in_len, out, max_out) &&
      (max_out < prefix || out + prefix != in)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_OUTPUT_ALIASES_INPUT);
    return false;
  }

  // Determine the parameters for the current epoch.
  DTLSWriteEpoch *write_epoch = dtls_get_write_epoch(ssl, epoch);
  if (write_epoch == nullptr) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  const size_t record_header_len = dtls_record_header_write_len(ssl, epoch);

  // Ensure the sequence number update does not overflow.
  DTLSRecordNumber record_number = write_epoch->next_record;
  if (!record_number.HasNext()) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_OVERFLOW);
    return false;
  }

  bool dtls13_header = use_dtls13_record_header(ssl, epoch);
  uint8_t *extra_in = NULL;
  size_t extra_in_len = 0;
  if (dtls13_header) {
    extra_in = &type;
    extra_in_len = 1;
  }

  size_t ciphertext_len;
  if (!write_epoch->aead->CiphertextLen(&ciphertext_len, in_len,
                                        extra_in_len)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_RECORD_TOO_LARGE);
    return false;
  }
  if (max_out < record_header_len + ciphertext_len) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_BUFFER_TOO_SMALL);
    return false;
  }

  uint16_t record_version = dtls_record_version(ssl);
  if (dtls13_header) {
    // The first byte of the DTLS 1.3 record header has the following format:
    // 0 1 2 3 4 5 6 7
    // +-+-+-+-+-+-+-+-+
    // |0|0|1|C|S|L|E E|
    // +-+-+-+-+-+-+-+-+
    //
    // We set C=0 (no Connection ID), S=1 (16-bit sequence number), L=1 (length
    // is present), which is a mask of 0x2c. The E E bits are the low-order two
    // bits of the epoch.
    //
    // +-+-+-+-+-+-+-+-+
    // |0|0|1|0|1|1|E E|
    // +-+-+-+-+-+-+-+-+
    out[0] = 0x2c | (epoch & 0x3);
    // We always use a two-byte sequence number. A one-byte sequence number
    // would require coordinating with the application on ACK feedback to know
    // that the peer is not too far behind.
    CRYPTO_store_u16_be(out + 1, write_epoch->next_record.sequence());
    // TODO(crbug.com/42290594): When we know the record is last in the packet,
    // omit the length.
    CRYPTO_store_u16_be(out + 3, ciphertext_len);
  } else {
    out[0] = type;
    CRYPTO_store_u16_be(out + 1, record_version);
    CRYPTO_store_u64_be(out + 3, record_number.combined());
    CRYPTO_store_u16_be(out + 11, ciphertext_len);
  }
  Span<const uint8_t> header(out, record_header_len);

  if (!write_epoch->aead->SealScatter(
          out + record_header_len, out + prefix, out + prefix + in_len, type,
          record_version, dtls_aead_sequence(ssl, record_number), header, in,
          in_len, extra_in, extra_in_len)) {
    return false;
  }

  // Perform record number encryption (RFC 9147 section 4.2.3).
  if (dtls13_header) {
    // Record number encryption uses bytes from the ciphertext as a sample to
    // generate the mask used for encryption. For simplicity, pass in the whole
    // ciphertext as the sample - GenerateRecordNumberMask will read only what
    // it needs (and error if |sample| is too short).
    Span<const uint8_t> sample(out + record_header_len, ciphertext_len);
    uint8_t mask[2];
    if (!write_epoch->rn_encrypter->GenerateMask(mask, sample)) {
      return false;
    }
    out[1] ^= mask[0];
    out[2] ^= mask[1];
  }

  *out_number = record_number;
  write_epoch->next_record = record_number.Next();
  *out_len = record_header_len + ciphertext_len;
  ssl_do_msg_callback(ssl, 1 /* write */, SSL3_RT_HEADER, header);
  return true;
}